

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3UnlinkAndDeleteIndex(sqlite3 *db,int iDb,char *zIdxName)

{
  Index *pIVar1;
  Index *p;
  Index **ppIVar2;
  Index *pIVar3;
  
  p = (Index *)sqlite3HashInsert(&(db->aDb[iDb].pSchema)->idxHash,zIdxName,(void *)0x0);
  if (p != (Index *)0x0) {
    pIVar1 = p->pTable->pIndex;
    if (pIVar1 == p) {
      ppIVar2 = &p->pTable->pIndex;
    }
    else {
      do {
        pIVar3 = pIVar1;
        if (pIVar3 == (Index *)0x0) goto LAB_00135916;
        pIVar1 = pIVar3->pNext;
      } while (pIVar3->pNext != p);
      ppIVar2 = &pIVar3->pNext;
    }
    *ppIVar2 = p->pNext;
LAB_00135916:
    freeIndex(db,p);
  }
  *(byte *)&db->flags = (byte)db->flags | 2;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UnlinkAndDeleteIndex(sqlite3 *db, int iDb, const char *zIdxName){
  Index *pIndex;
  Hash *pHash;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pHash = &db->aDb[iDb].pSchema->idxHash;
  pIndex = sqlite3HashInsert(pHash, zIdxName, 0);
  if( ALWAYS(pIndex) ){
    if( pIndex->pTable->pIndex==pIndex ){
      pIndex->pTable->pIndex = pIndex->pNext;
    }else{
      Index *p;
      /* Justification of ALWAYS();  The index must be on the list of
      ** indices. */
      p = pIndex->pTable->pIndex;
      while( ALWAYS(p) && p->pNext!=pIndex ){ p = p->pNext; }
      if( ALWAYS(p && p->pNext==pIndex) ){
        p->pNext = pIndex->pNext;
      }
    }
    freeIndex(db, pIndex);
  }
  db->flags |= SQLITE_InternChanges;
}